

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3NodeAddTerm(Fts3Table *p,SegmentNode **ppTree,int isCopyTerm,char *zTerm,int nTerm)

{
  uint uVar1;
  int iVar2;
  SegmentNode *pSVar3;
  bool bVar4;
  int iVar5;
  byte bVar6;
  byte *pbVar7;
  uchar *q_1;
  char *pcVar8;
  ulong uVar9;
  byte *pbVar10;
  char *nBytes;
  SegmentNode *pSVar11;
  int iVar12;
  ulong uVar13;
  size_t sVar14;
  undefined4 in_register_00000014;
  void *__src;
  size_t __n;
  int n;
  Fts3Table *pFVar15;
  int iVar16;
  uchar *q;
  bool bVar17;
  SegmentNode *pParent;
  SegmentNode *pNew;
  SegmentNode *local_48;
  SegmentNode *local_40;
  SegmentNode **local_38;
  
  __src = (void *)CONCAT44(in_register_00000014,isCopyTerm);
  pSVar3 = *ppTree;
  if (pSVar3 == (SegmentNode *)0x0) goto LAB_001d708a;
  iVar16 = pSVar3->nData;
  pcVar8 = pSVar3->zTerm;
  uVar1 = pSVar3->nTerm;
  if ((int)uVar1 < 1) {
    uVar9 = 0;
  }
  else {
    uVar13 = 0;
    do {
      uVar9 = uVar13;
      if (pcVar8[uVar13] != *(char *)((long)__src + uVar13)) break;
      uVar13 = uVar13 + 1;
      uVar9 = (ulong)uVar1;
    } while (uVar1 != uVar13);
  }
  iVar12 = (int)uVar9;
  uVar13 = (ulong)iVar12;
  iVar5 = (int)zTerm;
  n = (iVar16 + iVar5) - iVar12;
  uVar9 = uVar13;
  do {
    n = n + 1;
    bVar17 = 0x7f < uVar9;
    uVar9 = uVar9 >> 7;
  } while (bVar17);
  __n = (size_t)(iVar5 - iVar12);
  sVar14 = __n;
  do {
    n = n + 1;
    bVar17 = 0x7f < sVar14;
    sVar14 = sVar14 >> 7;
  } while (bVar17);
  iVar2 = p->nNodeSize;
  bVar17 = pcVar8 == (char *)0x0;
  local_38 = ppTree;
  if (bVar17 || n <= iVar2) {
    if (iVar2 < n) {
      pcVar8 = (char *)sqlite3_malloc(n);
      pSVar3->aData = pcVar8;
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x7;
        goto LAB_001d7077;
      }
    }
    if (pSVar3->zTerm != (char *)0x0) {
      uVar9 = uVar13;
      pbVar7 = (byte *)(pSVar3->aData + iVar16);
      do {
        pbVar10 = pbVar7;
        bVar6 = (byte)uVar9;
        *pbVar10 = bVar6 | 0x80;
        iVar16 = iVar16 + 1;
        bVar4 = 0x7f < uVar9;
        uVar9 = uVar9 >> 7;
        pbVar7 = pbVar10 + 1;
      } while (bVar4);
      *pbVar10 = bVar6;
    }
    pbVar7 = (byte *)(pSVar3->aData + iVar16);
    sVar14 = __n;
    do {
      pbVar10 = pbVar7;
      bVar6 = (byte)sVar14;
      *pbVar10 = bVar6 | 0x80;
      iVar16 = iVar16 + 1;
      bVar4 = 0x7f < sVar14;
      pbVar7 = pbVar10 + 1;
      sVar14 = sVar14 >> 7;
    } while (bVar4);
    *pbVar10 = bVar6;
    memcpy(pSVar3->aData + iVar16,(void *)(uVar13 + (long)__src),__n);
    pSVar3->nData = iVar16 + (iVar5 - iVar12);
    pSVar3->nEntry = pSVar3->nEntry + 1;
    if (pSVar3->nMalloc < iVar5) {
      pcVar8 = pSVar3->zMalloc;
      uVar1 = iVar5 * 2;
      iVar16 = sqlite3_initialize();
      nBytes = (char *)0x0;
      if (iVar16 == 0) {
        if (0 < (int)uVar1) {
          nBytes = (char *)(ulong)uVar1;
        }
        nBytes = (char *)sqlite3Realloc(pcVar8,(u64)nBytes);
      }
      if (nBytes == (char *)0x0) {
        pcVar8 = (char *)0x7;
        goto LAB_001d7077;
      }
      pSVar3->nMalloc = uVar1;
      pSVar3->zMalloc = nBytes;
    }
    pSVar3->zTerm = pSVar3->zMalloc;
    memcpy(pSVar3->zMalloc,__src,(long)iVar5);
    pSVar3->nTerm = iVar5;
    pcVar8 = (char *)0x0;
  }
LAB_001d7077:
  ppTree = local_38;
  if (bVar17 || n <= iVar2) {
    return (int)pcVar8;
  }
LAB_001d708a:
  pFVar15 = p;
  pSVar11 = (SegmentNode *)sqlite3_malloc(p->nNodeSize + 0x48);
  if (pSVar11 == (SegmentNode *)0x0) {
    iVar16 = 7;
  }
  else {
    pSVar11->zMalloc = (char *)0x0;
    *(undefined8 *)&pSVar11->nData = 0;
    pSVar11->zTerm = (char *)0x0;
    pSVar11->nTerm = 0;
    pSVar11->nMalloc = 0;
    pSVar11->pLeftmost = (SegmentNode *)0x0;
    *(undefined8 *)&pSVar11->nEntry = 0;
    pSVar11->pParent = (SegmentNode *)0x0;
    pSVar11->pRight = (SegmentNode *)0x0;
    pSVar11->nData = 0xb;
    pSVar11->aData = (char *)(pSVar11 + 1);
    local_40 = pSVar11;
    if (pSVar3 == (SegmentNode *)0x0) {
      pSVar11->pLeftmost = pSVar11;
      iVar16 = fts3NodeAddTerm(p,&local_40,isCopyTerm,(char *)((ulong)zTerm & 0xffffffff),
                               (int)pFVar15);
    }
    else {
      local_48 = pSVar3->pParent;
      iVar16 = fts3NodeAddTerm(p,&local_48,isCopyTerm,(char *)((ulong)zTerm & 0xffffffff),
                               (int)pFVar15);
      if (pSVar3->pParent == (SegmentNode *)0x0) {
        pSVar3->pParent = local_48;
      }
      pSVar3->pRight = pSVar11;
      pSVar11->pLeftmost = pSVar3->pLeftmost;
      pSVar11->pParent = local_48;
      pSVar11->zMalloc = pSVar3->zMalloc;
      pSVar11->nMalloc = pSVar3->nMalloc;
      pSVar3->zMalloc = (char *)0x0;
    }
    *ppTree = local_40;
  }
  return iVar16;
}

Assistant:

static int fts3NodeAddTerm(
  Fts3Table *p,                   /* Virtual table handle */
  SegmentNode **ppTree,           /* IN/OUT: SegmentNode handle */ 
  int isCopyTerm,                 /* True if zTerm/nTerm is transient */
  const char *zTerm,              /* Pointer to buffer containing term */
  int nTerm                       /* Size of term in bytes */
){
  SegmentNode *pTree = *ppTree;
  int rc;
  SegmentNode *pNew;

  /* First try to append the term to the current node. Return early if 
  ** this is possible.
  */
  if( pTree ){
    int nData = pTree->nData;     /* Current size of node in bytes */
    int nReq = nData;             /* Required space after adding zTerm */
    int nPrefix;                  /* Number of bytes of prefix compression */
    int nSuffix;                  /* Suffix length */

    nPrefix = fts3PrefixCompress(pTree->zTerm, pTree->nTerm, zTerm, nTerm);
    nSuffix = nTerm-nPrefix;

    nReq += sqlite3Fts3VarintLen(nPrefix)+sqlite3Fts3VarintLen(nSuffix)+nSuffix;
    if( nReq<=p->nNodeSize || !pTree->zTerm ){

      if( nReq>p->nNodeSize ){
        /* An unusual case: this is the first term to be added to the node
        ** and the static node buffer (p->nNodeSize bytes) is not large
        ** enough. Use a separately malloced buffer instead This wastes
        ** p->nNodeSize bytes, but since this scenario only comes about when
        ** the database contain two terms that share a prefix of almost 2KB, 
        ** this is not expected to be a serious problem. 
        */
        assert( pTree->aData==(char *)&pTree[1] );
        pTree->aData = (char *)sqlite3_malloc(nReq);
        if( !pTree->aData ){
          return SQLITE_NOMEM;
        }
      }

      if( pTree->zTerm ){
        /* There is no prefix-length field for first term in a node */
        nData += sqlite3Fts3PutVarint(&pTree->aData[nData], nPrefix);
      }

      nData += sqlite3Fts3PutVarint(&pTree->aData[nData], nSuffix);
      memcpy(&pTree->aData[nData], &zTerm[nPrefix], nSuffix);
      pTree->nData = nData + nSuffix;
      pTree->nEntry++;

      if( isCopyTerm ){
        if( pTree->nMalloc<nTerm ){
          char *zNew = sqlite3_realloc(pTree->zMalloc, nTerm*2);
          if( !zNew ){
            return SQLITE_NOMEM;
          }
          pTree->nMalloc = nTerm*2;
          pTree->zMalloc = zNew;
        }
        pTree->zTerm = pTree->zMalloc;
        memcpy(pTree->zTerm, zTerm, nTerm);
        pTree->nTerm = nTerm;
      }else{
        pTree->zTerm = (char *)zTerm;
        pTree->nTerm = nTerm;
      }
      return SQLITE_OK;
    }
  }

  /* If control flows to here, it was not possible to append zTerm to the
  ** current node. Create a new node (a right-sibling of the current node).
  ** If this is the first node in the tree, the term is added to it.
  **
  ** Otherwise, the term is not added to the new node, it is left empty for
  ** now. Instead, the term is inserted into the parent of pTree. If pTree 
  ** has no parent, one is created here.
  */
  pNew = (SegmentNode *)sqlite3_malloc(sizeof(SegmentNode) + p->nNodeSize);
  if( !pNew ){
    return SQLITE_NOMEM;
  }
  memset(pNew, 0, sizeof(SegmentNode));
  pNew->nData = 1 + FTS3_VARINT_MAX;
  pNew->aData = (char *)&pNew[1];

  if( pTree ){
    SegmentNode *pParent = pTree->pParent;
    rc = fts3NodeAddTerm(p, &pParent, isCopyTerm, zTerm, nTerm);
    if( pTree->pParent==0 ){
      pTree->pParent = pParent;
    }
    pTree->pRight = pNew;
    pNew->pLeftmost = pTree->pLeftmost;
    pNew->pParent = pParent;
    pNew->zMalloc = pTree->zMalloc;
    pNew->nMalloc = pTree->nMalloc;
    pTree->zMalloc = 0;
  }else{
    pNew->pLeftmost = pNew;
    rc = fts3NodeAddTerm(p, &pNew, isCopyTerm, zTerm, nTerm); 
  }

  *ppTree = pNew;
  return rc;
}